

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool pugi::impl::(anonymous_namespace)::set_value_integer<unsigned_int,char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,uint value,bool negative)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  char_t buf [64];
  char_t acStack_c [12];
  
  uVar5 = (ulong)(uint)-(int)header_mask;
  if (value == 0) {
    uVar5 = header_mask & 0xffffffff;
  }
  lVar3 = 0;
  do {
    lVar2 = lVar3;
    uVar4 = (uint)uVar5;
    acStack_c[lVar2 + 3] = (char)uVar5 + (char)(uVar5 / 10) * -10 | 0x30;
    lVar3 = lVar2 + -1;
    uVar5 = uVar5 / 10;
  } while (9 < uVar4);
  acStack_c[lVar2 + 2] = '-';
  uVar5 = (ulong)(byte)((byte)value ^ 1);
  bVar1 = strcpy_insitu<char*,unsigned_long>
                    (dest,header,0x10,acStack_c + uVar5 + lVar3 + 3,1 - (uVar5 + lVar3));
  return bVar1;
}

Assistant:

PUGI_IMPL_FN bool set_value_integer(String& dest, Header& header, uintptr_t header_mask, U value, bool negative)
	{
		char_t buf[64];
		char_t* end = buf + sizeof(buf) / sizeof(buf[0]);
		char_t* begin = integer_to_string(buf, end, value, negative);

		return strcpy_insitu(dest, header, header_mask, begin, end - begin);
	}